

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

uint __thiscall Model::texture_from_file(Model *this,char *file_path)

{
  ostream *poVar1;
  stbi_uc *retval_from_stbi_load;
  GLint GVar2;
  undefined4 uVar3;
  undefined1 local_80 [8];
  string file_name;
  uint texture;
  undefined1 local_40 [8];
  int img_width;
  GLsizei local_20;
  int local_1c;
  int img_height;
  int nr_channels;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,file_path,(allocator<char> *)(file_name.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &this->directory,'/');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::__cxx11::string::operator=((string *)local_80,(string *)(file_name.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::~string((string *)(file_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_80);
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar3 = 1;
  (*glad_glGenTextures)(1,(GLuint *)(file_name.field_2._M_local_buf + 8));
  retval_from_stbi_load = stbi_load((char *)local_80,(int *)local_40,&local_20,&local_1c,0);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Failed to load image data!\n");
    stbi_image_free((void *)0x0);
  }
  else {
    (*glad_glBindTexture)(0xde1,file_name.field_2._8_4_);
    GVar2 = 0x1903;
    if (local_1c != 1) {
      GVar2 = (local_1c == 4) + 0x1907;
    }
    (*glad_glTexImage2D)(0xde1,0,GVar2,local_40._0_4_,local_20,0,GVar2,0x1401,retval_from_stbi_load)
    ;
    (*glad_glGenerateMipmap)(0xde1);
    (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    stbi_image_free(retval_from_stbi_load);
    uVar3 = file_name.field_2._8_4_;
  }
  std::__cxx11::string::~string((string *)local_80);
  return uVar3;
}

Assistant:

unsigned int Model::texture_from_file(const char *file_path) {
  std::string file_name = std::string(file_path);
  file_name = directory + '/' + file_name;
  std::cout << file_name << std::endl;

  unsigned int texture;
  glGenTextures(1, &texture);

  // rgb image has 3 channels : r,g,b
  int img_width, img_height, nr_channels;
  unsigned char *img_data = stbi_load(file_name.c_str(), &img_width,
                                      &img_height, &nr_channels, 0);

  if (!img_data) {
    std::cerr << "Failed to load image data!\n";
    stbi_image_free(img_data);
    return 1;
  }

  GLenum format = GL_RGB;
  if (nr_channels == 1)
    format = GL_RED;
  else if (nr_channels == 4)
    format = GL_RGBA;

  glBindTexture(GL_TEXTURE_2D, texture);
  glTexImage2D(GL_TEXTURE_2D, 0, format, img_width, img_height, 0, format,
               GL_UNSIGNED_BYTE, img_data);
  glGenerateMipmap(GL_TEXTURE_2D); // only base mipmap generated since

  // set repeeat parameters for the texture on S and T axes
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

  // set filtering methods to mip maps (maginification/minification)
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,
                  GL_LINEAR_MIPMAP_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,
                  GL_LINEAR); // come back later, parameter might be mistake

  stbi_image_free(img_data);
  return texture;
}